

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall
FileTokenizer::createToken
          (FileTokenizer *this,TokenType type,size_t length,string *value,size_t valuePos,
          size_t valueLength)

{
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  Identifier local_a8;
  string local_78 [8];
  string originalStr;
  string valueStr;
  size_t valueLength_local;
  size_t valuePos_local;
  string *value_local;
  size_t length_local;
  TokenType type_local;
  FileTokenizer *this_local;
  
  (this->token).type = type;
  (this->token).line = this->lineNumber;
  (this->token).column = this->linePos + 1;
  std::__cxx11::string::substr((ulong)((long)&originalStr.field_2 + 8),(ulong)value);
  std::__cxx11::string::substr((ulong)local_78,(ulong)&this->currentLine);
  if ((type == Identifier) || (type == Equ)) {
    std::__cxx11::string::string
              ((string *)&local_c8,(string *)(originalStr.field_2._M_local_buf + 8));
    Identifier::Identifier(&local_a8,&local_c8);
    std::__cxx11::string::string((string *)&local_e8,local_78);
    Token::setValue<Identifier>(&this->token,&local_a8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    Identifier::~Identifier(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_108,(string *)(originalStr.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_128,local_78);
    Token::setValue<std::__cxx11::string>(&this->token,&local_108,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
  }
  this->linePos = length + this->linePos;
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(originalStr.field_2._M_local_buf + 8));
  return;
}

Assistant:

void FileTokenizer::createToken(TokenType type, size_t length, const std::string& value, size_t valuePos, size_t valueLength)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;

	std::string valueStr = value.substr(valuePos, valueLength);
	std::string originalStr = currentLine.substr(linePos, length);
	if (type == TokenType::Identifier || type == TokenType::Equ)
		token.setValue(Identifier(std::move(valueStr)), std::move(originalStr));
	else
		token.setValue(std::move(valueStr), std::move(originalStr));

	linePos += length;
}